

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_texture_thumbnail.cxx
# Opt level: O3

void __thiscall xray_re::xr_texture_thumbnail::xr_texture_thumbnail(xr_texture_thumbnail *this)

{
  this->_vptr_xr_texture_thumbnail = (_func_int **)&PTR__xr_texture_thumbnail_0024b3e0;
  this->data = (uint8_t *)0x0;
  (this->detail_name)._M_dataplus._M_p = (pointer)&(this->detail_name).field_2;
  (this->detail_name)._M_string_length = 0;
  (this->detail_name).field_2._M_local_buf[0] = '\0';
  (this->bump_name)._M_dataplus._M_p = (pointer)&(this->bump_name).field_2;
  (this->bump_name)._M_string_length = 0;
  (this->bump_name).field_2._M_local_buf[0] = '\0';
  (this->ext_normal_map_name)._M_dataplus._M_p = (pointer)&(this->ext_normal_map_name).field_2;
  (this->ext_normal_map_name)._M_string_length = 0;
  (this->ext_normal_map_name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

xr_texture_thumbnail::xr_texture_thumbnail():
	data(0) {}